

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_telnet.c
# Opt level: O3

void oonf_telnet_stop(oonf_telnet_data *data,_Bool print_prompt)

{
  int iVar1;
  _func_void_oonf_telnet_data_ptr *p_Var2;
  
  p_Var2 = data->stop_handler;
  if (p_Var2 != (_func_void_oonf_telnet_data_ptr *)0x0) {
    data->stop_handler = (_func_void_oonf_telnet_data_ptr *)0x0;
    (*p_Var2)(data);
  }
  data->show_echo = true;
  if (print_prompt) {
    abuf_puts(data->out,"> ");
  }
  iVar1 = *(int *)((long)&data[-1].cleanup_list.prev + 4);
  if ((iVar1 != 0) && (iVar1 != 3)) {
    oonf_stream_flush((oonf_stream_session *)(data + -3));
    return;
  }
  return;
}

Assistant:

void
oonf_telnet_stop(struct oonf_telnet_data *data, bool print_prompt) {
  _call_stop_handler(data);
  data->show_echo = true;
  if (print_prompt) {
    abuf_puts(data->out, "> ");
  }
  oonf_telnet_flush_session(data);
}